

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

QByteArray * __thiscall
QIODevicePrivate::peek(QByteArray *__return_storage_ptr__,QIODevicePrivate *this,qint64 maxSize)

{
  char *pcVar1;
  ssize_t size;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,maxSize,Uninitialized);
  pcVar1 = QByteArray::data(__return_storage_ptr__);
  size = read(this,(int)pcVar1,(void *)maxSize,1);
  if (size < maxSize) {
    if (size < 1) {
      QByteArray::clear(__return_storage_ptr__);
    }
    else {
      QByteArray::resize(__return_storage_ptr__,size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QIODevicePrivate::peek(qint64 maxSize)
{
    QByteArray result(maxSize, Qt::Uninitialized);

    const qint64 readBytes = read(result.data(), maxSize, true);

    if (readBytes < maxSize) {
        if (readBytes <= 0)
            result.clear();
        else
            result.resize(readBytes);
    }

    return result;
}